

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predefined_formatters.h
# Opt level: O2

void __thiscall
booster::locale::impl_icu::icu_formatters_cache::icu_formatters_cache
          (icu_formatters_cache *this,Locale *locale)

{
  EStyle EVar1;
  long *plVar2;
  long *plVar3;
  long lVar4;
  undefined1 *puVar5;
  long lVar6;
  undefined1 *puVar7;
  undefined1 *puVar8;
  thread_specific_ptr<icu_70::NumberFormat> *this_00;
  
  *(undefined4 *)&this->field_0x8 = 0;
  *(undefined ***)this = &PTR__icu_formatters_cache_001db308;
  lVar4 = 0x18;
  do {
    *(code **)((long)this + lVar4 + -8) =
         std::__cxx11::moneypunct_byname<wchar_t,false>::moneypunct_byname;
    *(undefined2 *)(&this->super_facet + lVar4) = 2;
    lVar4 = lVar4 + 0x40;
  } while (lVar4 != 0x118);
  puVar5 = &this->field_0x10;
  lVar4 = 0x118;
  do {
    *(code **)((long)this + lVar4 + -8) =
         std::__cxx11::moneypunct_byname<wchar_t,false>::moneypunct_byname;
    *(undefined2 *)(&this->super_facet + lVar4) = 2;
    lVar4 = lVar4 + 0x40;
  } while (lVar4 != 0x218);
  puVar8 = &this->field_0x110;
  lVar4 = 0x218;
  do {
    *(code **)((long)this + lVar4 + -8) =
         std::__cxx11::moneypunct_byname<wchar_t,false>::moneypunct_byname;
    *(undefined2 *)(&this->super_facet + lVar4) = 2;
    lVar4 = lVar4 + 0x40;
  } while (lVar4 != 0x618);
  puVar7 = &this->field_0x210;
  this_00 = this->number_format_;
  lVar4 = 0;
  do {
    thread_specific_ptr<icu_70::NumberFormat>::thread_specific_ptr(this_00);
    lVar4 = lVar4 + -8;
    this_00 = this_00 + 1;
  } while (lVar4 != -0x38);
  thread_specific_ptr<icu_70::SimpleDateFormat>::thread_specific_ptr(&this->date_formatter_);
  icu_70::Locale::Locale(&this->locale_,locale);
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    plVar2 = (long *)icu_70::DateFormat::createDateInstance
                               (icu_formatters_cache::styles[lVar4],locale);
    if (plVar2 != (long *)0x0) {
      plVar3 = (long *)__dynamic_cast(plVar2,&icu_70::DateFormat::typeinfo,
                                      &icu_70::SimpleDateFormat::typeinfo);
      if (plVar3 != (long *)0x0) {
        (**(code **)(*plVar3 + 0xf0))(plVar3,puVar5);
      }
      (**(code **)(*plVar2 + 8))(plVar2);
    }
    puVar5 = puVar5 + 0x40;
  }
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    plVar2 = (long *)icu_70::DateFormat::createTimeInstance
                               (icu_formatters_cache::styles[lVar4],locale);
    if (plVar2 != (long *)0x0) {
      plVar3 = (long *)__dynamic_cast(plVar2,&icu_70::DateFormat::typeinfo,
                                      &icu_70::SimpleDateFormat::typeinfo);
      if (plVar3 != (long *)0x0) {
        (**(code **)(*plVar3 + 0xf0))(plVar3,puVar8);
      }
      (**(code **)(*plVar2 + 8))(plVar2);
    }
    puVar8 = puVar8 + 0x40;
  }
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    EVar1 = icu_formatters_cache::styles[lVar4];
    puVar5 = puVar7;
    for (lVar6 = 0; lVar6 != 4; lVar6 = lVar6 + 1) {
      plVar2 = (long *)icu_70::DateFormat::createDateTimeInstance
                                 (EVar1,icu_formatters_cache::styles[lVar6],locale);
      if (plVar2 != (long *)0x0) {
        plVar3 = (long *)__dynamic_cast(plVar2,&icu_70::DateFormat::typeinfo,
                                        &icu_70::SimpleDateFormat::typeinfo,0);
        if (plVar3 != (long *)0x0) {
          (**(code **)(*plVar3 + 0xf0))(plVar3,puVar5);
        }
        (**(code **)(*plVar2 + 8))(plVar2);
      }
      puVar5 = puVar5 + 0x40;
    }
    puVar7 = puVar7 + 0x100;
  }
  return;
}

Assistant:

icu_formatters_cache(icu::Locale const &locale) :
                locale_(locale)
            {

                static const icu::DateFormat::EStyle styles[4] = { 
                    icu::DateFormat::kShort,
                    icu::DateFormat::kMedium,
                    icu::DateFormat::kLong,
                    icu::DateFormat::kFull
                };


                for(int i=0;i<4;i++) {
                    std::unique_ptr<icu::DateFormat> fmt(icu::DateFormat::createDateInstance(styles[i],locale));
                    icu::SimpleDateFormat *sfmt = dynamic_cast<icu::SimpleDateFormat*>(fmt.get());
                    if(sfmt) {
                        sfmt->toPattern(date_format_[i]);
                    }
                }

                for(int i=0;i<4;i++) {
                    std::unique_ptr<icu::DateFormat> fmt(icu::DateFormat::createTimeInstance(styles[i],locale));
                    icu::SimpleDateFormat *sfmt = dynamic_cast<icu::SimpleDateFormat*>(fmt.get());
                    if(sfmt) {
                        sfmt->toPattern(time_format_[i]);
                    }
                }

                for(int i=0;i<4;i++) {
                    for(int j=0;j<4;j++) {
                        std::unique_ptr<icu::DateFormat> fmt(
                            icu::DateFormat::createDateTimeInstance(styles[i],styles[j],locale));
                        icu::SimpleDateFormat *sfmt = dynamic_cast<icu::SimpleDateFormat*>(fmt.get());
                        if(sfmt) {
                            sfmt->toPattern(date_time_format_[i][j]);
                        }
                    }
                }


            }